

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

void __thiscall
cs::compiler_type::translate_into_tokens
          (compiler_type *this,deque<char,_std::allocator<char>_> *char_buff,
          deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *tokens,charset encoding)

{
  undefined8 in_RDI;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *unaff_retaddr;
  deque<char,_std::allocator<char>_> *in_stack_00000008;
  compiler_type *in_stack_00000010;
  context_t *in_stack_00000018;
  preprocessor *in_stack_00000020;
  preprocessor *in_stack_ffffffffffffff40;
  
  preprocessor::preprocessor
            (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,
             (charset)((ulong)in_RDI >> 0x20));
  preprocessor::~preprocessor(in_stack_ffffffffffffff40);
  return;
}

Assistant:

void compiler_type::translate_into_tokens(const std::deque<char> &char_buff, std::deque<token_base *> &tokens,
	        charset encoding)
	{
		preprocessor(context, *this, char_buff, tokens, encoding);
	}